

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::ToPropertyDescriptorForGenericObjects
               (Var propertySpec,PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  BOOL BVar4;
  Type TVar5;
  RecyclableObject *pRVar6;
  undefined4 *puVar7;
  RecyclableObject *this;
  PropertyRecord *pPVar8;
  PropertyId propertyId;
  Var local_38;
  Var value;
  
  BVar4 = IsObject(propertySpec);
  if (BVar4 == 0) {
    return 0;
  }
  pRVar6 = VarTo<Js::RecyclableObject>(propertySpec);
  BVar4 = GetProperty_InternalSimple(pRVar6,pRVar6,0x194,&local_38,scriptContext);
  if (BVar4 != 0) {
    BVar4 = JavascriptConversion::ToBoolean(local_38,scriptContext);
    PropertyDescriptor::SetEnumerable(descriptor,BVar4 != 0);
  }
  BVar4 = GetProperty_InternalSimple(pRVar6,pRVar6,0x195,&local_38,scriptContext);
  if (BVar4 != 0) {
    BVar4 = JavascriptConversion::ToBoolean(local_38,scriptContext);
    PropertyDescriptor::SetConfigurable(descriptor,BVar4 != 0);
  }
  BVar4 = GetProperty_InternalSimple(pRVar6,pRVar6,0x197,&local_38,scriptContext);
  if (BVar4 != 0) {
    PropertyDescriptor::SetValue(descriptor,local_38);
  }
  BVar4 = GetProperty_InternalSimple(pRVar6,pRVar6,0x196,&local_38,scriptContext);
  if (BVar4 != 0) {
    BVar4 = JavascriptConversion::ToBoolean(local_38,scriptContext);
    PropertyDescriptor::SetWritable(descriptor,BVar4 != 0);
  }
  BVar4 = GetProperty_InternalSimple(pRVar6,pRVar6,0x198,&local_38,scriptContext);
  pvVar2 = local_38;
  if (BVar4 != 0) {
    if (local_38 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00acafc5;
      *puVar7 = 0;
    }
    if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00acafc5;
      *puVar7 = 0;
    }
    if (pvVar2 < (Var)0x4000000000000 && ((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) {
      this = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00acafc5;
        *puVar7 = 0;
      }
      TVar5 = ((this->type).ptr)->typeId;
      if (0x57 < (int)TVar5) {
        BVar4 = RecyclableObject::IsExternal(this);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar3) goto LAB_00acafc5;
          *puVar7 = 0;
        }
        TVar5 = TypeIds_FirstNumberType;
      }
    }
    else {
      TVar5 = TypeIds_FirstNumberType;
    }
    if ((TVar5 != TypeIds_Undefined) && (bVar3 = JavascriptConversion::IsCallable(local_38), !bVar3)
       ) {
      propertyId = 0x198;
      goto LAB_00acafd9;
    }
    PropertyDescriptor::SetGetter(descriptor,local_38);
  }
  BVar4 = GetProperty_InternalSimple(pRVar6,pRVar6,0x19b,&local_38,scriptContext);
  pvVar2 = local_38;
  if (BVar4 == 0) {
    return 1;
  }
  if (local_38 == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00acafc5;
    *puVar7 = 0;
  }
  if (((ulong)pvVar2 & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)pvVar2 & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00acafc5;
    *puVar7 = 0;
  }
  if (pvVar2 < (Var)0x4000000000000 && ((ulong)pvVar2 & 0xffff000000000000) != 0x1000000000000) {
    pRVar6 = UnsafeVarTo<Js::RecyclableObject>(pvVar2);
    if (pRVar6 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00acafc5;
      *puVar7 = 0;
    }
    TVar5 = ((pRVar6->type).ptr)->typeId;
    if (0x57 < (int)TVar5) {
      BVar4 = RecyclableObject::IsExternal(pRVar6);
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar3) {
LAB_00acafc5:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      goto LAB_00acaf8f;
    }
  }
  else {
LAB_00acaf8f:
    TVar5 = TypeIds_FirstNumberType;
  }
  if ((TVar5 == TypeIds_Undefined) || (bVar3 = JavascriptConversion::IsCallable(local_38), bVar3)) {
    PropertyDescriptor::SetSetter(descriptor,local_38);
    return 1;
  }
  propertyId = 0x19b;
LAB_00acafd9:
  pPVar8 = ScriptContext::GetPropertyName(scriptContext,propertyId);
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec45,(PCWSTR)(pPVar8 + 1));
}

Assistant:

BOOL JavascriptOperators::ToPropertyDescriptorForGenericObjects(Var propertySpec, PropertyDescriptor* descriptor, ScriptContext* scriptContext)
    {
        if (!JavascriptOperators::IsObject(propertySpec))
        {
            return FALSE;
        }

        Var value;
        RecyclableObject* propertySpecObj = VarTo<RecyclableObject>(propertySpec);

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::enumerable, &value, scriptContext))
        {
            descriptor->SetEnumerable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::configurable, &value, scriptContext))
        {
            descriptor->SetConfigurable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::value, &value, scriptContext))
        {
            descriptor->SetValue(value);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::writable, &value, scriptContext))
        {
            descriptor->SetWritable(JavascriptConversion::ToBoolean(value, scriptContext) ? true : false);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::get, &value, scriptContext))
        {
            if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::get)->GetBuffer());
            }
            descriptor->SetGetter(value);
        }

        if (JavascriptOperators::GetPropertyNoCache(propertySpecObj, PropertyIds::set, &value, scriptContext))
        {
            if (JavascriptOperators::GetTypeId(value) != TypeIds_Undefined && (false == JavascriptConversion::IsCallable(value)))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_NeedFunction, scriptContext->GetPropertyName(PropertyIds::set)->GetBuffer());
            }
            descriptor->SetSetter(value);
        }

        return TRUE;
    }